

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rcu_list.hpp
# Opt level: O3

iterator __thiscall
gmlc::libguarded::rcu_list<int,_std::mutex,_std::allocator<int>_>::erase
          (rcu_list<int,_std::mutex,_std::allocator<int>_> *this,const_iterator iter)

{
  node *pnVar1;
  rcu_list<int,_std::mutex,_std::allocator<int>_> *prVar2;
  int iVar3;
  __pointer_type pzVar4;
  __pointer_type pzVar5;
  __pointer_type pzVar6;
  rcu_list<int,_std::mutex,_std::allocator<int>_> *prVar7;
  rcu_list<int,_std::mutex,_std::allocator<int>_> *prVar8;
  bool bVar9;
  
  iVar3 = pthread_mutex_lock((pthread_mutex_t *)&this->m_write_mutex);
  if (iVar3 != 0) {
    std::__throw_system_error(iVar3);
  }
  pnVar1 = ((iter.m_current)->next)._M_b._M_p;
  if ((iter.m_current)->deleted == false) {
    (iter.m_current)->deleted = true;
    prVar2 = (rcu_list<int,_std::mutex,_std::allocator<int>_> *)((iter.m_current)->back)._M_b._M_p;
    prVar7 = (rcu_list<int,_std::mutex,_std::allocator<int>_> *)((iter.m_current)->next)._M_b._M_p;
    prVar8 = prVar2;
    if (prVar2 == (rcu_list<int,_std::mutex,_std::allocator<int>_> *)0x0) {
      prVar8 = this;
    }
    LOCK();
    (prVar8->m_head)._M_b._M_p = (__pointer_type)prVar7;
    UNLOCK();
    if (prVar7 == (rcu_list<int,_std::mutex,_std::allocator<int>_> *)0x0) {
      prVar7 = this;
    }
    LOCK();
    (prVar7->m_tail)._M_b._M_p = (__pointer_type)prVar2;
    UNLOCK();
    pzVar4 = (__pointer_type)operator_new(0x18);
    (pzVar4->next)._M_b._M_p = (__pointer_type)0x0;
    (pzVar4->owner)._M_b._M_p = (__pointer_type)0x0;
    pzVar4->zombie_node = iter.m_current;
    pzVar5 = (this->m_zombie_head)._M_b._M_p;
    do {
      LOCK();
      (pzVar4->next)._M_b._M_p = pzVar5;
      UNLOCK();
      LOCK();
      pzVar6 = (this->m_zombie_head)._M_b._M_p;
      bVar9 = pzVar5 == pzVar6;
      if (bVar9) {
        (this->m_zombie_head)._M_b._M_p = pzVar4;
        pzVar6 = pzVar5;
      }
      UNLOCK();
      pzVar5 = pzVar6;
    } while (!bVar9);
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->m_write_mutex);
  return (iterator)pnVar1;
}

Assistant:

auto rcu_list<T, M, Alloc>::erase(const_iterator iter) -> iterator
{
    std::lock_guard<M> guard(m_write_mutex);
    // make sure the node has not already been marked for deletion
    node* oldNextOrig = iter.m_current->next.load();
    if (!iter.m_current->deleted) {
        iter.m_current->deleted = true;

        node* oldPrev = iter.m_current->back.load();
        node* oldNext = iter.m_current->next.load();

        if (oldPrev) {
            oldPrev->next.store(oldNext);
        } else {
            // no previous node, this node was the head
            m_head.store(oldNext);
        }

        if (oldNext) {
            oldNext->back.store(oldPrev);
        } else {
            // no next node, this node was the tail
            m_tail.store(oldPrev);
        }

        auto newZombie = zombie_alloc_trait::allocate(m_zombie_alloc, 1);
        zombie_alloc_trait::construct(m_zombie_alloc,
                                      newZombie,
                                      iter.m_current);

        zombie_list_node* oldZombie = m_zombie_head.load();

        do {
            newZombie->next = oldZombie;
        } while (!m_zombie_head.compare_exchange_weak(oldZombie, newZombie));
    }

    return iterator(oldNextOrig);
}